

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O2

void __thiscall HighsPrimalHeuristics::rootReducedCost(HighsPrimalHeuristics *this)

{
  double dVar1;
  double from_lower_bound;
  HighsMipSolver *pHVar2;
  HighsLp *lp;
  pointer ppVar3;
  bool bVar4;
  int iVar5;
  long n;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var6;
  pair<double,_HighsDomainChange> *domchg;
  pointer ppVar7;
  double dVar8;
  double dVar9;
  double to_lower_bound;
  vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
  lurkingBounds;
  _Vector_base<double,_std::allocator<double>_> local_3e8;
  _Vector_base<double,_std::allocator<double>_> local_3d0;
  HeuristicNeighbourhood neighbourhood;
  HighsDomain localdom;
  
  HighsRedcostFixing::getLurkingBounds
            (&lurkingBounds,
             &((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->redcostfixing,
             this->mipsolver);
  ppVar3 = lurkingBounds.
           super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = lurkingBounds.
           super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  n = ((long)lurkingBounds.
             super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)lurkingBounds.
            super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  _Var6._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  if ((ulong)((long)*(pointer *)((long)&(_Var6._M_head_impl)->integral_cols + 8) -
              *(long *)&((_Var6._M_head_impl)->integral_cols).
                        super__Vector_base<int,_std::allocator<int>_> >> 2) <= (ulong)(n * 10)) {
    if (lurkingBounds.
        super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        lurkingBounds.
        super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar5 = pdqsort_detail::log2<long>(n);
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0,false>
                (ppVar7,ppVar3,iVar5,1);
      _Var6._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    }
    HighsDomain::HighsDomain(&localdom,&(_Var6._M_head_impl)->domain);
    HeuristicNeighbourhood::HeuristicNeighbourhood(&neighbourhood,this->mipsolver,&localdom);
    _Var6._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    dVar9 = (_Var6._M_head_impl)->lower_bound;
    dVar1 = (_Var6._M_head_impl)->feastol;
    for (ppVar7 = lurkingBounds.
                  super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (ppVar7 != lurkingBounds.
                   super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish &&
        (dVar8 = ppVar7->first, dVar9 + dVar1 < dVar8)); ppVar7 = ppVar7 + 1) {
      bVar4 = HighsDomain::isActive(&localdom,&ppVar7->second);
      if (!bVar4) {
        HighsDomain::changeBound(&localdom,ppVar7->second,(Reason)0xffffffff);
        while( true ) {
          HighsDomain::propagate(&localdom);
          if (localdom.infeasible_ != true) break;
          HighsDomain::conflictAnalysis
                    (&localdom,
                     &((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                      conflictPool);
          pHVar2 = this->mipsolver;
          _Var6._M_head_impl =
               (pHVar2->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
          from_lower_bound = (_Var6._M_head_impl)->lower_bound;
          to_lower_bound = dVar8;
          if (dVar8 <= from_lower_bound) {
            to_lower_bound = from_lower_bound;
          }
          (_Var6._M_head_impl)->lower_bound = to_lower_bound;
          if (pHVar2->submip == false) {
            if ((to_lower_bound != from_lower_bound) ||
               (NAN(to_lower_bound) || NAN(from_lower_bound))) {
              HighsMipSolverData::updatePrimalDualIntegral
                        (_Var6._M_head_impl,from_lower_bound,to_lower_bound,
                         (_Var6._M_head_impl)->upper_bound,(_Var6._M_head_impl)->upper_bound,true,
                         true);
            }
          }
          HighsDomain::backtrack(&localdom);
          if ((int)((ulong)((long)localdom.branchPos_.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)localdom.branchPos_.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2) == 0) break;
          HeuristicNeighbourhood::backtracked(&neighbourhood);
        }
        dVar8 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
        if (0.5 <= dVar8) break;
      }
    }
    dVar9 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
    if (0.3 <= dVar9) {
      lp = this->mipsolver->model_;
      _Var6._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_3d0,&localdom.col_lower_);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_3e8,&localdom.col_upper_);
      solveSubMip(this,lp,&(_Var6._M_head_impl)->firstrootbasis,dVar9,
                  (vector<double,_std::allocator<double>_> *)&local_3d0,
                  (vector<double,_std::allocator<double>_> *)&local_3e8,500,
                  (int)(((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                        num_nodes / 0x14) + 200,0xc);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_3e8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_3d0);
    }
    HighsHashTable<int,_void>::~HighsHashTable(&neighbourhood.fixedCols);
    HighsDomain::~HighsDomain(&localdom);
  }
  std::
  _Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
  ::~_Vector_base(&lurkingBounds.
                   super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                 );
  return;
}

Assistant:

void HighsPrimalHeuristics::rootReducedCost() {
  std::vector<std::pair<double, HighsDomainChange>> lurkingBounds =
      mipsolver.mipdata_->redcostfixing.getLurkingBounds(mipsolver);
  if (10 * lurkingBounds.size() < mipsolver.mipdata_->integral_cols.size())
    return;
  pdqsort(lurkingBounds.begin(), lurkingBounds.end(),
          [](const std::pair<double, HighsDomainChange>& a,
             const std::pair<double, HighsDomainChange>& b) {
            return a.first > b.first;
          });

  auto localdom = mipsolver.mipdata_->domain;

  HeuristicNeighbourhood neighbourhood(mipsolver, localdom);

  double currCutoff = kHighsInf;
  double lower_bound;

  lower_bound = mipsolver.mipdata_->lower_bound + mipsolver.mipdata_->feastol;

  for (const std::pair<double, HighsDomainChange>& domchg : lurkingBounds) {
    currCutoff = domchg.first;

    if (currCutoff <= lower_bound) break;

    if (localdom.isActive(domchg.second)) continue;
    localdom.changeBound(domchg.second);

    while (true) {
      localdom.propagate();
      if (localdom.infeasible()) {
        localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);

        double prev_lower_bound = mipsolver.mipdata_->lower_bound;

        mipsolver.mipdata_->lower_bound =
            std::max(mipsolver.mipdata_->lower_bound, currCutoff);

        const bool bound_change =
            mipsolver.mipdata_->lower_bound != prev_lower_bound;
        if (!mipsolver.submip && bound_change)
          mipsolver.mipdata_->updatePrimalDualIntegral(
              prev_lower_bound, mipsolver.mipdata_->lower_bound,
              mipsolver.mipdata_->upper_bound, mipsolver.mipdata_->upper_bound);
        localdom.backtrack();
        if (localdom.getBranchDepth() == 0) break;
        neighbourhood.backtracked();
        continue;
      }
      break;
    }
    double fixingRate = neighbourhood.getFixingRate();
    if (fixingRate >= 0.5) break;
    // double gap = (currCutoff - mipsolver.mipdata_->lower_bound) /
    //             std::max(std::abs(mipsolver.mipdata_->lower_bound), 1.0);
    // if (gap < 0.001) break;
  }

  double fixingRate = neighbourhood.getFixingRate();
  if (fixingRate < 0.3) return;

  solveSubMip(*mipsolver.model_, mipsolver.mipdata_->firstrootbasis, fixingRate,
              localdom.col_lower_, localdom.col_upper_,
              500,  // std::max(50, int(0.05 *
                    // (mipsolver.mipdata_->num_leaves))),
              200 + mipsolver.mipdata_->num_nodes / 20, 12);
}